

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O0

double __thiscall tcu::FloatFormat::round(FloatFormat *this,double __x)

{
  int exponent;
  byte in_SIL;
  double dVar1;
  double local_50;
  double roundFrac;
  double shiftFrac;
  int shift;
  double frac;
  int exp;
  bool upward_local;
  double d_local;
  FloatFormat *this_local;
  
  frac._7_1_ = in_SIL & 1;
  frac._0_4_ = 0;
  _exp = __x;
  d_local = (double)this;
  dVar1 = deFractExp(__x,(int *)&frac);
  exponent = exponentShift(this,frac._0_4_);
  dVar1 = deLdExp(dVar1,exponent);
  if ((frac._7_1_ & 1) == 0) {
    local_50 = deFloor(dVar1);
  }
  else {
    local_50 = deCeil(dVar1);
  }
  dVar1 = deLdExp(local_50,frac._0_4_ - exponent);
  return dVar1;
}

Assistant:

double FloatFormat::round (double d, bool upward) const
{
	int				exp			= 0;
	const double	frac		= deFractExp(d, &exp);
	const int		shift		= exponentShift(exp);
	const double	shiftFrac	= deLdExp(frac, shift);
	const double	roundFrac	= upward ? deCeil(shiftFrac) : deFloor(shiftFrac);

	return deLdExp(roundFrac, exp - shift);
}